

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_reporter.c
# Opt level: O2

void xml_reporter_finish_test(TestReporter *reporter,char *filename,int line,char *message)

{
  int iVar1;
  long lVar2;
  long lVar3;
  size_t sVar4;
  undefined8 uVar5;
  long lVar6;
  FILE *__stream;
  undefined8 local_1030;
  char childData [4096];
  
  lVar2 = (long)context_stack_p;
  lVar3 = lVar2 * 0x28;
  reporter_finish_test(reporter,filename,line,message);
  xmlFreeTextWriter(child_output_writer);
  xmlFormatProp(*(xmlNodePtr *)(&DAT_00117f98 + lVar3),(xmlChar *)"time","%.5f",
                (double)reporter->duration / 1000.0);
  (&context_stack_p)[lVar2 * 10] = (&context_stack_p)[lVar2 * 10] + reporter->duration;
  lVar6 = 0;
  fseek((FILE *)child_output_tmpfile,0,0);
  __stream = (FILE *)child_output_tmpfile;
  do {
    iVar1 = feof(__stream);
    if (iVar1 != 0) {
      fclose((FILE *)child_output_tmpfile);
      if (lVar6 != 0) {
        childData[lVar6] = '\0';
        iVar1 = xmlParseBalancedChunkMemoryRecover
                          ((&output)[lVar2 * 5],0,0,0,childData,&local_1030,1);
        if (iVar1 != 0) {
          uVar5 = xmlNewChild(*(undefined8 *)(&DAT_00117f98 + lVar3),0,"error",0);
          xmlNewProp(uVar5,"type","Fatal");
          xmlNewProp(uVar5,"message",
                     "Test result XML truncated or malformed, likely from abnormal process termination"
                    );
        }
        xmlAddChildList(*(undefined8 *)(&DAT_00117f98 + lVar3),local_1030);
      }
      return;
    }
    sVar4 = fread(childData + lVar6,1,0x1000 - lVar6,(FILE *)child_output_tmpfile);
    __stream = (FILE *)child_output_tmpfile;
    iVar1 = ferror((FILE *)child_output_tmpfile);
    lVar6 = lVar6 + sVar4;
  } while (iVar1 == 0);
  abort();
}

Assistant:

static void xml_reporter_finish_test(TestReporter *reporter, const char *filename, int line, const char *message) {
    XmlMemo *memo = (XmlMemo *)reporter->memo;
    FILE *out = file_stack[file_stack_p-1];

    reporter_finish_test(reporter, filename, line, message);
    memo->printer(out, " time=\"%.5f\">\n", (double)reporter->duration/(double)1000);
    if (output && strlen(output) == 0) {
        free(output);
        output = NULL;
    }

    transfer_output_from(child_output_tmpfile, memo->printer, out);

    memo->printer(out, indent(reporter));
    memo->printer(out, "</testcase>\n");
    fflush(out);
}